

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.h
# Opt level: O0

void __thiscall
draco::PointAttribute::GetMappedValue(PointAttribute *this,PointIndex point_index,void *out_data)

{
  PointIndex in_ESI;
  PointAttribute *in_RDI;
  AttributeValueIndex unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  
  mapped_index(in_RDI,in_ESI);
  GeometryAttribute::GetValue
            ((GeometryAttribute *)CONCAT44(in_ESI.value_,in_stack_fffffffffffffff8),unaff_retaddr,
             in_RDI);
  return;
}

Assistant:

void GetMappedValue(PointIndex point_index, void *out_data) const {
    return GetValue(mapped_index(point_index), out_data);
  }